

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_112f20f::HandleLockCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  _Alloc_hider _Var6;
  ulong uVar7;
  string *in_base;
  Status SVar8;
  FILE *__stream;
  cmGlobalGenerator *pcVar9;
  pointer pcVar10;
  pointer pbVar11;
  pointer pcVar12;
  uint uVar13;
  ulong uVar14;
  cmFileLockPool *this;
  bool bVar15;
  bool bVar16;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  cmFileLockResult fileLockResult;
  string path;
  string resultVariable;
  string parentDir;
  string result;
  int local_164;
  undefined1 local_150 [24];
  char *local_138;
  size_type local_130;
  char *local_128;
  undefined8 local_120;
  char *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  cmFileLockResult local_108;
  undefined1 local_100 [48];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x21) {
    pcVar1 = status->Makefile;
    local_150._0_8_ = local_150 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"sub-command LOCK requires at least two arguments.","");
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_150);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    bVar4 = false;
    goto LAB_00360d4e;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar10 = pbVar11[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar10,pcVar10 + pbVar11[1]._M_string_length);
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar15 = (ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x41;
  bVar4 = !bVar15;
  if (bVar15) {
    bVar3 = false;
    local_164 = 2;
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xffffffffffffffff;
    bVar15 = false;
  }
  else {
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xffffffffffffffff;
    local_164 = 2;
    bVar15 = false;
    bVar3 = false;
    uVar14 = 2;
    do {
      uVar13 = (uint)uVar14;
      iVar5 = std::__cxx11::string::compare((char *)(pbVar11 + uVar14));
      if (iVar5 == 0) {
        bVar15 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar14));
        if (iVar5 == 0) {
          bVar3 = true;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar14));
          if (iVar5 == 0) {
            uVar13 = uVar13 + 1;
            uVar14 = (ulong)uVar13;
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (uVar14 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11
                                >> 5)) {
              iVar5 = std::__cxx11::string::compare((char *)(pbVar11 + uVar14));
              bVar2 = true;
              if (iVar5 == 0) {
                local_164 = 0;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar5 == 0) {
                  local_164 = 1;
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar14));
                  if (iVar5 != 0) {
                    pcVar1 = status->Makefile;
                    pbVar11 = (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    local_150._0_8_ = (pointer)0x2e;
                    local_150._8_8_ = "expected FUNCTION, FILE or PROCESS after GUARD";
                    local_150._16_8_ = (pointer)0xe;
                    local_138 = ", but got:\n  \"";
                    local_128 = pbVar11[uVar14]._M_dataplus._M_p;
                    local_130 = pbVar11[uVar14]._M_string_length;
                    local_120 = 2;
                    local_118 = "\".";
                    views_00._M_len = 4;
                    views_00._M_array = (iterator)local_150;
                    cmCatViews_abi_cxx11_((string *)local_100,views_00);
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_100);
                    pcVar10 = (pointer)local_100._16_8_;
                    pcVar12 = (pointer)local_100._0_8_;
                    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) goto LAB_00360b4f;
                    goto LAB_00360b57;
                  }
                  local_164 = 2;
                }
              }
            }
            else {
              pcVar1 = status->Makefile;
              local_150._0_8_ = local_150 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_150,"expected FUNCTION, FILE or PROCESS after GUARD","");
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_150);
              pcVar10 = (pointer)local_150._16_8_;
              pcVar12 = (pointer)local_150._0_8_;
              if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
LAB_00360b4f:
                operator_delete(pcVar12,(ulong)(pcVar10 + 1));
              }
LAB_00360b57:
              bVar2 = false;
            }
            if (!bVar2) break;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar14));
            if (iVar5 == 0) {
              uVar13 = uVar13 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar13) {
                pcVar1 = status->Makefile;
                local_150._0_8_ = local_150 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_150,"expected variable name after RESULT_VARIABLE","");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_150);
LAB_00360f84:
                pcVar10 = (pointer)local_150._16_8_;
                pcVar12 = (pointer)local_150._0_8_;
                if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) goto LAB_00360f9c;
                break;
              }
              std::__cxx11::string::_M_assign((string *)&local_b0);
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar5 != 0) {
                pcVar1 = status->Makefile;
                pbVar11 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_150._0_8_ = (pointer)0x37;
                local_150._8_8_ = "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ";
                local_150._16_8_ = (pointer)0x12;
                local_138 = "TIMEOUT\nbut got: \"";
                local_128 = pbVar11[uVar14]._M_dataplus._M_p;
                local_130 = pbVar11[uVar14]._M_string_length;
                local_120 = 2;
                local_118 = "\".";
                views_03._M_len = 4;
                views_03._M_array = (iterator)local_150;
                cmCatViews_abi_cxx11_((string *)local_100,views_03);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_100);
                pcVar10 = (pointer)local_100._16_8_;
                pcVar12 = (pointer)local_100._0_8_;
                if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
LAB_00360f9c:
                  operator_delete(pcVar12,(ulong)(pcVar10 + 1));
                }
                break;
              }
              uVar13 = uVar13 + 1;
              uVar14 = (ulong)uVar13;
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
                  uVar14) {
                pcVar1 = status->Makefile;
                local_150._0_8_ = local_150 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_150,"expected timeout value after TIMEOUT","");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_150);
                goto LAB_00360f84;
              }
              bVar2 = cmStrToLong(pbVar11 + uVar14,(long *)&local_90);
              bVar16 = (long)local_90._M_dataplus._M_p < 0;
              _Var6._M_p = local_90._M_dataplus._M_p;
              if (!bVar2 || bVar16) {
                pcVar1 = status->Makefile;
                pbVar11 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_138 = pbVar11[uVar14]._M_dataplus._M_p;
                local_150._16_8_ = pbVar11[uVar14]._M_string_length;
                local_150._0_8_ = (pointer)0xf;
                local_150._8_8_ = "TIMEOUT value \"";
                local_130 = 0x1d;
                local_128 = "\" is not an unsigned integer.";
                views._M_len = 3;
                views._M_array = (iterator)local_150;
                cmCatViews_abi_cxx11_((string *)local_100,views);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_100);
                _Var6._M_p = (pointer)local_110;
                if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
                  operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
                  _Var6._M_p = (pointer)local_110;
                }
              }
              local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var6._M_p;
              if (!bVar2 || bVar16) break;
            }
          }
        }
      }
      uVar14 = (ulong)(uVar13 + 1);
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5;
      bVar4 = uVar14 < uVar7;
    } while (uVar14 < uVar7);
  }
  if (bVar4) {
    bVar4 = false;
  }
  else {
    if (bVar15) {
      std::__cxx11::string::append((char *)&local_d0);
    }
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    cmsys::SystemTools::CollapseFullPath((string *)local_150,&local_d0,in_base);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_150);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    cmsys::SystemTools::GetParentDirectory(&local_90,&local_d0);
    SVar8 = cmsys::SystemTools::MakeDirectory(&local_90,(mode_t *)0x0);
    if (SVar8.Kind_ == Success) {
      __stream = (FILE *)cmsys::SystemTools::Fopen(&local_d0,"w");
      if (__stream == (FILE *)0x0) {
        pcVar1 = status->Makefile;
        local_150._0_8_ = (pointer)0x8;
        local_150._8_8_ = "file\n  \"";
        local_150._16_8_ = local_d0._M_string_length;
        local_138 = local_d0._M_dataplus._M_p;
        local_130 = 0x26;
        local_128 = "\"\ncreation failed (check permissions).";
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_150;
        cmCatViews_abi_cxx11_((string *)local_100,views_02);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_100);
        goto LAB_00360ce1;
      }
      fclose(__stream);
      pcVar9 = cmMakefile::GetGlobalGenerator(status->Makefile);
      local_108 = cmFileLockResult::MakeOk();
      this = &pcVar9->FileLockPool;
      if (bVar3) {
        local_108 = cmFileLockPool::Release(this,&local_d0);
      }
      else if (local_164 == 2) {
        local_108 = cmFileLockPool::LockProcessScope(this,&local_d0,(unsigned_long)local_110);
      }
      else if (local_164 == 1) {
        local_108 = cmFileLockPool::LockFileScope(this,&local_d0,(unsigned_long)local_110);
      }
      else {
        local_108 = cmFileLockPool::LockFunctionScope(this,&local_d0,(unsigned_long)local_110);
      }
      cmFileLockResult::GetOutputMessage_abi_cxx11_(&local_70,&local_108);
      if ((local_b0._M_string_length != 0) || (bVar4 = cmFileLockResult::IsOk(&local_108), bVar4)) {
        bVar4 = true;
        if (local_b0._M_string_length != 0) {
          value._M_str = local_70._M_dataplus._M_p;
          value._M_len = local_70._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,&local_b0,value);
        }
      }
      else {
        pcVar1 = status->Makefile;
        local_150._0_8_ = (pointer)0x16;
        local_150._8_8_ = "error locking file\n  \"";
        local_100._0_8_ = local_d0._M_string_length;
        local_100._8_8_ = local_d0._M_dataplus._M_p;
        cmStrCat<char[3],std::__cxx11::string,char[2]>
                  (&local_50,(cmAlphaNum *)local_150,(cmAlphaNum *)local_100,(char (*) [3])0x79e069,
                   &local_70,(char (*) [2])0x76858c);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccurred = true;
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pcVar1 = status->Makefile;
      local_150._0_8_ = (pointer)0xd;
      local_150._8_8_ = "directory\n  \"";
      local_150._16_8_ = local_90._M_string_length;
      local_138 = local_90._M_dataplus._M_p;
      local_130 = 0x26;
      local_128 = "\"\ncreation failed (check permissions).";
      views_01._M_len = 3;
      views_01._M_array = (iterator)local_150;
      cmCatViews_abi_cxx11_((string *)local_100,views_01);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_100);
LAB_00360ce1:
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
      }
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
LAB_00360d4e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool HandleLockCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(merr, ", but got:\n  \"", args[i], "\"."));
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR, "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmStrToLong(args[i], &scanned) || scanned < 0) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("TIMEOUT value \"", args[i],
                   "\" is not an unsigned integer."));
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                 "TIMEOUT\nbut got: \"", args[i], "\"."));
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(
    path, status.GetMakefile().GetCurrentSourceDirectory());

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("directory\n  \"", parentDir,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("file\n  \"", path,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    status.GetMakefile().GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccurred();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("error locking file\n  \"", path, "\"\n", result, "."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!resultVariable.empty()) {
    status.GetMakefile().AddDefinition(resultVariable, result);
  }

  return true;
#else
  static_cast<void>(args);
  status.SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}